

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O3

Expr * __thiscall SQCompilation::SQParser::LogicalOrExp(SQParser *this)

{
  Expr *pEVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Expr *pEVar6;
  Expr *pEVar7;
  Chunk *pCVar8;
  int iVar9;
  
  uVar5 = this->_depth;
  if (500 < uVar5) {
    reportDiagnostic(this,0x1d);
    uVar5 = this->_depth;
  }
  this->_depth = uVar5 + 1;
  pEVar6 = LogicalAndExp(this);
  iVar9 = 1;
  while( true ) {
    uVar5 = this->_depth;
    if (500 < uVar5) {
      reportDiagnostic(this,0x1d);
      uVar5 = this->_depth;
    }
    this->_depth = uVar5 + 1;
    if (this->_token != 0x10f) break;
    Lex(this);
    pEVar7 = LogicalOrExp(this);
    pCVar8 = Arena::findChunk(this->_astArena,0x30);
    pEVar1 = (Expr *)pCVar8->_ptr;
    pCVar8->_ptr = (uint8_t *)&pEVar1[1].super_Node._coordinates.lineEnd;
    (pEVar1->super_Node)._op = TO_OROR;
    (pEVar1->super_Node)._coordinates.lineStart = -1;
    (pEVar1->super_Node)._coordinates.columnStart = -1;
    (pEVar1->super_Node)._coordinates.lineEnd = -1;
    (pEVar1->super_Node)._coordinates.columnEnd = -1;
    (pEVar1->super_Node).super_ArenaObj._vptr_ArenaObj = (_func_int **)&PTR__ArenaObj_001a2c10;
    pEVar1[1].super_Node.super_ArenaObj._vptr_ArenaObj = (_func_int **)pEVar6;
    *(Expr **)&pEVar1[1].super_Node._coordinates = pEVar7;
    iVar3 = (pEVar7->super_Node)._coordinates.lineEnd;
    iVar4 = (pEVar7->super_Node)._coordinates.columnEnd;
    iVar2 = (pEVar6->super_Node)._coordinates.columnStart;
    (pEVar1->super_Node)._coordinates.lineStart = (pEVar6->super_Node)._coordinates.lineStart;
    (pEVar1->super_Node)._coordinates.columnStart = iVar2;
    (pEVar1->super_Node)._coordinates.lineEnd = iVar3;
    (pEVar1->super_Node)._coordinates.columnEnd = iVar4;
    iVar9 = iVar9 + 1;
    pEVar6 = pEVar1;
  }
  this->_depth = uVar5 - iVar9;
  return pEVar6;
}

Assistant:

Expr* SQParser::LogicalOrExp()
{
    NestingChecker nc(this);
    Expr *lhs = LogicalAndExp();
    for (;;) {
        nc.inc();
        if (_token == TK_OR) {
            Lex();

            Expr *rhs = LogicalOrExp();
            lhs = newNode<BinExpr>(TO_OROR, lhs, rhs);
        }
        else return lhs;
    }
}